

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectASingleCallThatDoesntHappen_Test::testBody
          (TEST_MockCallTest_expectASingleCallThatDoesntHappen_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockCallTest_expectASingleCallThatDoesntHappen_Test *local_10;
  TEST_MockCallTest_expectASingleCallThatDoesntHappen_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"func");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_40);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar1 & 1),"CHECK","mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x40,pTVar4);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_60);
  return;
}

Assistant:

TEST(MockCallTest, expectASingleCallThatDoesntHappen)
{
    mock().expectOneCall("func");
    CHECK(mock().expectedCallsLeft());
    mock().clear();
}